

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionFrame
          (ChElementBeamEuler *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  ChVector<double> v_1;
  ChVector<double> u_rotaz;
  ChVector<double> v;
  ChVector<double> u_displ;
  ChQuaternion<double> local_e8;
  ChQuaternion<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_38 = 0.0;
  local_a8.m_data[2] = 0.0;
  dVar4 = (1.0 - eta) * 0.5;
  dVar5 = (eta + 1.0) * 0.5;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x16]
  )(this,&local_48);
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_88.m_data[2] =
       dVar4 * (peVar2->X0).coord.pos.m_data[2] + dVar5 * (peVar3->X0).coord.pos.m_data[2];
  local_88.m_data[0] =
       dVar4 * (peVar2->X0).coord.pos.m_data[0] + dVar5 * (peVar3->X0).coord.pos.m_data[0];
  local_88.m_data[1] =
       dVar4 * (peVar2->X0).coord.pos.m_data[1] + dVar5 * (peVar3->X0).coord.pos.m_data[1];
  ChQuaternion<double>::RotateBack(&this->q_element_ref_rot,&local_88);
  local_c8.m_data[0] = local_48 + local_68;
  local_c8.m_data[1] = dStack_40 + dStack_60;
  local_c8.m_data[2] = local_38 + local_58;
  ChQuaternion<double>::Rotate(&this->q_element_abs_rot,(ChVector<double> *)&local_c8);
  if (&local_e8 != (ChQuaternion<double> *)point) {
    point->m_data[0] = local_e8.m_data[0];
    point->m_data[1] = local_e8.m_data[1];
    point->m_data[2] = local_e8.m_data[2];
  }
  dVar4 = ChVector<double>::Length(&local_a8);
  ChVector<double>::GetNormalized((ChVector<double> *)&local_c8,&local_a8);
  dVar5 = sin(dVar4 * 0.5);
  local_e8.m_data[0] = cos(dVar4 * 0.5);
  local_e8.m_data[1] = dVar5 * local_c8.m_data[0];
  local_e8.m_data[2] = dVar5 * local_c8.m_data[1];
  local_e8.m_data[3] = dVar5 * local_c8.m_data[2];
  ChQuaternion<double>::operator%(&local_c8,&this->q_element_abs_rot,&local_e8);
  ChQuaternion<double>::operator=(rot,&local_c8);
  return;
}

Assistant:

void ChElementBeamEuler::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);

    this->EvaluateSectionDisplacement(eta, u_displ, u_rotaz);

    // Since   d = [Atw]' Xt - [A0w]'X0   , so we have
    //        Xt = [Atw] (d +  [A0w]'X0)

    point = this->q_element_abs_rot.Rotate(u_displ +
                                           this->q_element_ref_rot.RotateBack(Nx1 * this->nodes[0]->GetX0().GetPos() +
                                                                              Nx2 * this->nodes[1]->GetX0().GetPos()));

    ChQuaternion<> msectionrot;
    msectionrot.Q_from_AngAxis(u_rotaz.Length(), u_rotaz.GetNormalized());
    rot = this->q_element_abs_rot % msectionrot;
}